

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shiftFvec(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this)

{
  pointer pnVar1;
  pointer pnVar2;
  double dVar3;
  double maximum;
  type_conflict5 tVar4;
  bool bVar5;
  cpp_dec_float<100U,_int,_void> *pcVar6;
  uint i;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  allow;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxrandom;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minrandom;
  cpp_dec_float<100U,_int,_void> local_318;
  Random *local_2c8;
  Real local_2c0;
  cpp_dec_float<100U,_int,_void> local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  cpp_dec_float<100U,_int,_void> local_1c8;
  cpp_dec_float<100U,_int,_void> local_178;
  cpp_dec_float<100U,_int,_void> local_128;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0x40240000;
  entertol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_d8,this);
  local_88.fpclass = cpp_dec_float_finite;
  local_88.prec_elem = 0x10;
  local_88.data._M_elems[0] = 0;
  local_88.data._M_elems[1] = 0;
  local_88.data._M_elems[2] = 0;
  local_88.data._M_elems[3] = 0;
  local_88.data._M_elems[4] = 0;
  local_88.data._M_elems[5] = 0;
  local_88.data._M_elems[6] = 0;
  local_88.data._M_elems[7] = 0;
  local_88.data._M_elems[8] = 0;
  local_88.data._M_elems[9] = 0;
  local_88.data._M_elems[10] = 0;
  local_88.data._M_elems[0xb] = 0;
  local_88.data._M_elems[0xc] = 0;
  local_88.data._M_elems[0xd] = 0;
  local_88.data._M_elems._56_5_ = 0;
  local_88.data._M_elems[0xf]._1_3_ = 0;
  local_88.exp = 0;
  local_88.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
            (&local_88,&local_d8,(double *)&local_128);
  local_318.data._M_elems[0] = 0;
  local_318.data._M_elems[1] = 0x40590000;
  entertol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_128,this);
  local_d8.fpclass = cpp_dec_float_finite;
  local_d8.prec_elem = 0x10;
  local_d8.data._M_elems[0] = 0;
  local_d8.data._M_elems[1] = 0;
  local_d8.data._M_elems[2] = 0;
  local_d8.data._M_elems[3] = 0;
  local_d8.data._M_elems[4] = 0;
  local_d8.data._M_elems[5] = 0;
  local_d8.data._M_elems[6] = 0;
  local_d8.data._M_elems[7] = 0;
  local_d8.data._M_elems[8] = 0;
  local_d8.data._M_elems[9] = 0;
  local_d8.data._M_elems[10] = 0;
  local_d8.data._M_elems[0xb] = 0;
  local_d8.data._M_elems[0xc] = 0;
  local_d8.data._M_elems[0xd] = 0;
  local_d8.data._M_elems._56_5_ = 0;
  local_d8.data._M_elems[0xf]._1_3_ = 0;
  local_d8.exp = 0;
  local_d8.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
            (&local_d8,&local_128,(double *)&local_318);
  entertol((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)&local_318,this);
  epsilon((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_2b8,this);
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 0x10;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.data._M_elems[10] = 0;
  local_128.data._M_elems[0xb] = 0;
  local_128.data._M_elems[0xc] = 0;
  local_128.data._M_elems[0xd] = 0;
  local_128.data._M_elems._56_5_ = 0;
  local_128.data._M_elems[0xf]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_128,&local_318,&local_2b8);
  i = (this->thecovectors->set).thenum;
  local_2c8 = &this->random;
LAB_00303151:
  while( true ) {
    if ((int)i < 1) {
      return;
    }
    i = i - 1;
    local_318.fpclass = cpp_dec_float_finite;
    local_318.prec_elem = 0x10;
    local_318.data._M_elems[0] = 0;
    local_318.data._M_elems[1] = 0;
    local_318.data._M_elems[2] = 0;
    local_318.data._M_elems[3] = 0;
    local_318.data._M_elems[4] = 0;
    local_318.data._M_elems[5] = 0;
    local_318.data._M_elems[6] = 0;
    local_318.data._M_elems[7] = 0;
    local_318.data._M_elems[8] = 0;
    local_318.data._M_elems[9] = 0;
    local_318.data._M_elems[10] = 0;
    local_318.data._M_elems[0xb] = 0;
    local_318.data._M_elems[0xc] = 0;
    local_318.data._M_elems[0xd] = 0;
    local_318.data._M_elems._56_5_ = 0;
    local_318.data._M_elems[0xf]._1_3_ = 0;
    local_318.exp = 0;
    local_318.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_318,
               &(this->theUBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&local_128);
    tVar4 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_318,
                       (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i);
    if (!tVar4) goto LAB_0030331f;
    local_2b8.fpclass = cpp_dec_float_finite;
    local_2b8.prec_elem = 0x10;
    local_2b8.data._M_elems[0] = 0;
    local_2b8.data._M_elems[1] = 0;
    local_2b8.data._M_elems[2] = 0;
    local_2b8.data._M_elems[3] = 0;
    local_2b8.data._M_elems[4] = 0;
    local_2b8.data._M_elems[5] = 0;
    local_2b8.data._M_elems[6] = 0;
    local_2b8.data._M_elems[7] = 0;
    local_2b8.data._M_elems[8] = 0;
    local_2b8.data._M_elems[9] = 0;
    local_2b8.data._M_elems[10] = 0;
    local_2b8.data._M_elems[0xb] = 0;
    local_2b8.data._M_elems[0xc] = 0;
    local_2b8.data._M_elems[0xd] = 0;
    local_2b8.data._M_elems._56_5_ = 0;
    local_2b8.data._M_elems[0xf]._1_3_ = 0;
    local_2b8.exp = 0;
    local_2b8.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_2b8,
               &(this->theFvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
               &(this->theUBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
    local_318.fpclass = cpp_dec_float_finite;
    local_318.prec_elem = 0x10;
    local_318.data._M_elems[0] = 0;
    local_318.data._M_elems[1] = 0;
    local_318.data._M_elems[2] = 0;
    local_318.data._M_elems[3] = 0;
    local_318.data._M_elems[4] = 0;
    local_318.data._M_elems[5] = 0;
    local_318.data._M_elems[6] = 0;
    local_318.data._M_elems[7] = 0;
    local_318.data._M_elems[8] = 0;
    local_318.data._M_elems[9] = 0;
    local_318.data._M_elems[10] = 0;
    local_318.data._M_elems[0xb] = 0;
    local_318.data._M_elems[0xc] = 0;
    local_318.data._M_elems[0xd] = 0;
    local_318.data._M_elems._56_5_ = 0;
    local_318.data._M_elems[0xf]._1_3_ = 0;
    local_318.exp = 0;
    local_318.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_318,&local_2b8,&local_128);
    bVar5 = boost::multiprecision::operator!=
                      ((this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i,
                       (this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i);
    pcVar6 = &(this->theFvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    if (!bVar5) break;
    local_2c0 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_double
                          (&local_88);
    dVar3 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_double
                      (&local_d8);
    local_318.data._M_elems._0_8_ = Random::next(local_2c8,local_2c0,dVar3);
    local_178.fpclass = cpp_dec_float_finite;
    local_178.prec_elem = 0x10;
    local_178.data._M_elems[0] = 0;
    local_178.data._M_elems[1] = 0;
    local_178.data._M_elems[2] = 0;
    local_178.data._M_elems[3] = 0;
    local_178.data._M_elems[4] = 0;
    local_178.data._M_elems[5] = 0;
    local_178.data._M_elems[6] = 0;
    local_178.data._M_elems[7] = 0;
    local_178.data._M_elems[8] = 0;
    local_178.data._M_elems[9] = 0;
    local_178.data._M_elems[10] = 0;
    local_178.data._M_elems[0xb] = 0;
    local_178.data._M_elems[0xc] = 0;
    local_178.data._M_elems[0xd] = 0;
    local_178.data._M_elems._56_5_ = 0;
    local_178.data._M_elems[0xf]._1_3_ = 0;
    local_178.exp = 0;
    local_178.neg = false;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
              (&local_178,pcVar6,(double *)&local_318);
    shiftUBbound(this,i,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_178);
  }
  local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pcVar6->data)._M_elems;
  local_218.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 2);
  local_218.m_backend.data._M_elems._16_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 4);
  local_218.m_backend.data._M_elems._24_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 6);
  local_218.m_backend.data._M_elems._32_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 8);
  local_218.m_backend.data._M_elems._40_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 10);
  local_218.m_backend.data._M_elems._48_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 0xc);
  local_218.m_backend.data._M_elems._56_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 0xe);
  local_218.m_backend.exp = pcVar6->exp;
  local_218.m_backend.neg = pcVar6->neg;
  local_218.m_backend.fpclass = pcVar6->fpclass;
  local_218.m_backend.prec_elem = pcVar6->prec_elem;
  shiftUBbound(this,i,&local_218);
  pnVar1 = (this->theUBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar2 = (this->theLBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  goto LAB_003035cc;
LAB_0030331f:
  pnVar1 = (this->theFvec->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_318.fpclass = cpp_dec_float_finite;
  local_318.prec_elem = 0x10;
  local_318.data._M_elems[0] = 0;
  local_318.data._M_elems[1] = 0;
  local_318.data._M_elems[2] = 0;
  local_318.data._M_elems[3] = 0;
  local_318.data._M_elems[4] = 0;
  local_318.data._M_elems[5] = 0;
  local_318.data._M_elems[6] = 0;
  local_318.data._M_elems[7] = 0;
  local_318.data._M_elems[8] = 0;
  local_318.data._M_elems[9] = 0;
  local_318.data._M_elems[10] = 0;
  local_318.data._M_elems[0xb] = 0;
  local_318.data._M_elems[0xc] = 0;
  local_318.data._M_elems[0xd] = 0;
  local_318.data._M_elems._56_5_ = 0;
  local_318.data._M_elems[0xf]._1_3_ = 0;
  local_318.exp = 0;
  local_318.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&local_318,
             &(this->theLBbound).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend,&local_128);
  tVar4 = boost::multiprecision::operator<
                    (pnVar1 + i,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_318);
  if (tVar4) {
    local_2b8.fpclass = cpp_dec_float_finite;
    local_2b8.prec_elem = 0x10;
    local_2b8.data._M_elems[0] = 0;
    local_2b8.data._M_elems[1] = 0;
    local_2b8.data._M_elems[2] = 0;
    local_2b8.data._M_elems[3] = 0;
    local_2b8.data._M_elems[4] = 0;
    local_2b8.data._M_elems[5] = 0;
    local_2b8.data._M_elems[6] = 0;
    local_2b8.data._M_elems[7] = 0;
    local_2b8.data._M_elems[8] = 0;
    local_2b8.data._M_elems[9] = 0;
    local_2b8.data._M_elems[10] = 0;
    local_2b8.data._M_elems[0xb] = 0;
    local_2b8.data._M_elems[0xc] = 0;
    local_2b8.data._M_elems[0xd] = 0;
    local_2b8.data._M_elems._56_5_ = 0;
    local_2b8.data._M_elems[0xf]._1_3_ = 0;
    local_2b8.exp = 0;
    local_2b8.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_2b8,
               &(this->theLBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend,
               &(this->theFvec->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend);
    local_318.fpclass = cpp_dec_float_finite;
    local_318.prec_elem = 0x10;
    local_318.data._M_elems[0] = 0;
    local_318.data._M_elems[1] = 0;
    local_318.data._M_elems[2] = 0;
    local_318.data._M_elems[3] = 0;
    local_318.data._M_elems[4] = 0;
    local_318.data._M_elems[5] = 0;
    local_318.data._M_elems[6] = 0;
    local_318.data._M_elems[7] = 0;
    local_318.data._M_elems[8] = 0;
    local_318.data._M_elems[9] = 0;
    local_318.data._M_elems[10] = 0;
    local_318.data._M_elems[0xb] = 0;
    local_318.data._M_elems[0xc] = 0;
    local_318.data._M_elems[0xd] = 0;
    local_318.data._M_elems._56_5_ = 0;
    local_318.data._M_elems[0xf]._1_3_ = 0;
    local_318.exp = 0;
    local_318.neg = false;
    boost::multiprecision::default_ops::
    eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
              (&local_318,&local_2b8,&local_128);
    bVar5 = boost::multiprecision::operator!=
                      ((this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i,
                       (this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + i);
    pcVar6 = &(this->theFvec->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
    if (bVar5) {
      dVar3 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_double
                        (&local_88);
      maximum = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::extract_double
                          (&local_d8);
      local_318.data._M_elems._0_8_ = Random::next(local_2c8,dVar3,maximum);
      local_1c8.fpclass = cpp_dec_float_finite;
      local_1c8.prec_elem = 0x10;
      local_1c8.data._M_elems[0] = 0;
      local_1c8.data._M_elems[1] = 0;
      local_1c8.data._M_elems[2] = 0;
      local_1c8.data._M_elems[3] = 0;
      local_1c8.data._M_elems[4] = 0;
      local_1c8.data._M_elems[5] = 0;
      local_1c8.data._M_elems[6] = 0;
      local_1c8.data._M_elems[7] = 0;
      local_1c8.data._M_elems[8] = 0;
      local_1c8.data._M_elems[9] = 0;
      local_1c8.data._M_elems[10] = 0;
      local_1c8.data._M_elems[0xb] = 0;
      local_1c8.data._M_elems[0xc] = 0;
      local_1c8.data._M_elems[0xd] = 0;
      local_1c8.data._M_elems._56_5_ = 0;
      local_1c8.data._M_elems[0xf]._1_3_ = 0;
      local_1c8.exp = 0;
      local_1c8.neg = false;
      boost::multiprecision::default_ops::
      eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,double>
                (&local_1c8,pcVar6,(double *)&local_318);
      shiftLBbound(this,i,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_1c8);
    }
    else {
      local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pcVar6->data)._M_elems;
      local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 2);
      local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 4);
      local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 6);
      local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 8);
      local_268.m_backend.data._M_elems._40_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 10);
      local_268.m_backend.data._M_elems._48_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 0xc);
      local_268.m_backend.data._M_elems._56_8_ = *(undefined8 *)((pcVar6->data)._M_elems + 0xe);
      local_268.m_backend.exp = pcVar6->exp;
      local_268.m_backend.neg = pcVar6->neg;
      local_268.m_backend.fpclass = pcVar6->fpclass;
      local_268.m_backend.prec_elem = pcVar6->prec_elem;
      shiftLBbound(this,i,&local_268);
      pnVar1 = (this->theLBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar2 = (this->theUBbound).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
LAB_003035cc:
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                (&pnVar2[i].m_backend,&pnVar1[i].m_backend);
    }
  }
  goto LAB_00303151;
}

Assistant:

void SPxSolverBase<R>::shiftFvec()
{

   /* the allowed tolerance is (rep() == COLUMN) ? tolerances()->floatingPointFeastol() : tolerances()->floatingPointOpttol() because theFvec is the primal VectorBase<R> in COLUMN
    * and the dual VectorBase<R> in ROW representation; this is equivalent to entertol()
    */
   R minrandom = 10.0 * entertol();
   R maxrandom = 100.0 * entertol();
   R allow = entertol() - epsilon();

   assert(type() == ENTER);
   assert(allow > 0);

   for(int i = dim() - 1; i >= 0; --i)
   {
      if(theUBbound[i] + allow < (*theFvec)[i])
      {
         SPxOut::debug(this, "DSHIFT08 theUBbound[{}] violated by {}", i,
                       (*theFvec)[i] - theUBbound[i] - allow);

         if(theUBbound[i] != theLBbound[i])
         {
            // since minrandom and maxrandom are of the order 10 different,
            // we currently doesn't care about higher precision random
            // numbers. Hence the cast to double.
            shiftUBbound(i, (*theFvec)[i] + random.next((double)minrandom, (double)maxrandom));
         }
         else
         {
            shiftUBbound(i, (*theFvec)[i]);
            theLBbound[i] = theUBbound[i];
         }
      }
      else if((*theFvec)[i] < theLBbound[i] - allow)
      {
         SPxOut::debug(this, "DSHIFT08 theLBbound[{}] violated by {}", i,
                       theLBbound[i] - (*theFvec)[i] - allow);

         if(theUBbound[i] != theLBbound[i])
            shiftLBbound(i, (*theFvec)[i] - random.next((double)minrandom, (double)maxrandom));
         else
         {
            shiftLBbound(i, (*theFvec)[i]);
            theUBbound[i] = theLBbound[i];
         }
      }
   }

#ifndef NDEBUG
   testBounds();
   SPxOut::debug(this, "DSHIFT01 shiftFvec: OK\n");
#endif
}